

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O3

double * inform_local_block_entropy
                   (int *series,size_t n,size_t m,int b,size_t k,double *be,inform_error *err)

{
  int *piVar1;
  _Bool _Var2;
  double *__ptr;
  double *__ptr_00;
  undefined4 *__ptr_01;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  undefined4 *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  _Var2 = check_arguments(series,n,m,b,k,err);
  if (_Var2) {
    return (double *)0x0;
  }
  lVar10 = ((m - k) + 1) * n;
  __ptr = be;
  if ((be != (double *)0x0) || (__ptr = (double *)malloc(lVar10 * 8), __ptr != (double *)0x0)) {
    auVar13._8_4_ = (int)(k >> 0x20);
    auVar13._0_8_ = k;
    auVar13._12_4_ = 0x45300000;
    dVar11 = pow((double)b,
                 (auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __ptr_00 = (double *)
               calloc((long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f | (long)dVar11,4
                     );
    if (__ptr_00 == (double *)0x0) {
      __ptr_00 = __ptr;
      if (be != (double *)0x0) goto LAB_001578cc;
    }
    else {
      __ptr_01 = (undefined4 *)malloc(lVar10 * 4);
      if (__ptr_01 != (undefined4 *)0x0) {
        if (n != 0) {
          sVar5 = 0;
          puVar6 = __ptr_01;
          do {
            if (k == 1) {
              iVar7 = 1;
              iVar8 = 0;
            }
            else {
              uVar3 = 0;
              iVar7 = 1;
              iVar8 = 0;
              do {
                iVar7 = iVar7 * b;
                iVar8 = iVar8 * b + series[uVar3];
                uVar3 = uVar3 + 1;
              } while (k - 1 != uVar3);
            }
            if (k - 1 < m) {
              lVar9 = (long)(iVar8 * b) + (long)series[k - 1];
              *puVar6 = (int)lVar9;
              piVar1 = (int *)((long)__ptr_00 + lVar9 * 4);
              *piVar1 = *piVar1 + 1;
              if (m != k) {
                lVar4 = 0;
                do {
                  lVar9 = (long)(((int)lVar9 - series[lVar4] * iVar7) * b) + (long)series[k + lVar4]
                  ;
                  piVar1 = (int *)((long)__ptr_00 + lVar9 * 4);
                  *piVar1 = *piVar1 + 1;
                  puVar6[lVar4 + 1] = (int)lVar9;
                  lVar4 = lVar4 + 1;
                } while (m - k != lVar4);
              }
            }
            series = series + m;
            puVar6 = puVar6 + ((m + 1) - k);
            sVar5 = sVar5 + 1;
          } while (sVar5 != n);
          if (lVar10 != 0) {
            auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
            auVar12._0_8_ = lVar10;
            auVar12._12_4_ = 0x45300000;
            lVar9 = 0;
            do {
              dVar11 = log2((double)*(uint *)((long)__ptr_00 + (long)(int)__ptr_01[lVar9] * 4) /
                            ((auVar12._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)));
              __ptr[lVar9] = -dVar11;
              lVar9 = lVar9 + 1;
            } while (lVar10 - lVar9 != 0);
          }
        }
        free(__ptr_01);
        free(__ptr_00);
        return __ptr;
      }
      if (be == (double *)0x0) {
        free(__ptr);
      }
    }
    free(__ptr_00);
  }
LAB_001578cc:
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, double *be, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k + 1);

    bool allocate_be = (be == NULL);
    if (allocate_be)
    {
        be = malloc(N * sizeof(double));
        if (be == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        if (allocate_be) free(be);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states = { data, states_size, N };

    int *state = malloc(N * sizeof(int));
    if (state == NULL)
    {
        if (allocate_be) free(be);
        free(data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    accumulate_local_observations(series, n, m, b, k, &states, state);

    double s;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        be[i] = -log2(s/N);
    }

    free(state);
    free(data);

    return be;
}